

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_klass.cpp
# Opt level: O1

shared_ptr<const_HawkTracer::parser::EventKlassField> __thiscall
HawkTracer::parser::EventKlass::get_field(EventKlass *this,char *name,bool recursive)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_HawkTracer::parser::EventKlassField> sVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)name);
  if (iVar1 == 0) {
    _get_field(this,name,recursive);
    pthread_mutex_unlock((pthread_mutex_t *)name);
    sVar2.super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar2.super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (shared_ptr<const_HawkTracer::parser::EventKlassField>)
           sVar2.
           super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

std::shared_ptr<const EventKlassField> EventKlass::get_field(const char* name, bool recursive) const
{
    std::lock_guard<std::mutex> l(_fields_mtx);

    return _get_field(name, recursive);
}